

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

char * dictionary_get(dictionary *d,char *key,char *def)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  uVar1 = dictionary_hash(key);
  lVar3 = 0;
  lVar4 = d->size;
  if (d->size < 1) {
    lVar4 = lVar3;
  }
  while( true ) {
    if (lVar4 == lVar3) {
      return def;
    }
    if (((d->key[lVar3] != (char *)0x0) && (uVar1 == d->hash[lVar3])) &&
       (iVar2 = strcmp(key,d->key[lVar3]), iVar2 == 0)) break;
    lVar3 = lVar3 + 1;
  }
  return d->val[lVar3];
}

Assistant:

const char * dictionary_get(const dictionary * d, const char * key, const char * def)
{
    unsigned    hash ;
    ssize_t      i ;

    hash = dictionary_hash(key);
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i] == NULL)
            continue ;
        /* Compare hash */
        if (hash == d->hash[i]) {
            /* Compare string, to avoid hash collisions */
            if (!strcmp(key, d->key[i])) {
                return d->val[i] ;
            }
        }
    }
    return def ;
}